

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

StaticArray<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Corrade::Utility::String::anon_unknown_0::rpartitionInternal
          (StaticArray<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,anon_unknown_0 *this,string *string,
          ArrayView<const_char> separator)

{
  long lVar1;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  lVar1 = std::__cxx11::string::rfind((char *)this,(ulong)string,0xffffffffffffffff);
  if (lVar1 == -1) {
    local_60 = local_50;
    local_58 = 0;
    local_50[0] = 0;
    local_80 = local_70;
    local_78 = 0;
    local_70[0] = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)this);
    std::__cxx11::string::substr((ulong)&local_80,(ulong)this);
  }
  std::__cxx11::string::substr((ulong)local_40,(ulong)this);
  Containers::Implementation::StaticArrayData<3ul,std::__cxx11::string,false>::
  StaticArrayData<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((StaticArrayData<3ul,std::__cxx11::string,false> *)__return_storage_ptr__,&local_60,
             &local_80,local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Containers::StaticArray<3, std::string> rpartitionInternal(const std::string& string, Containers::ArrayView<const char> separator) {
    const std::size_t pos = string.rfind(separator, std::string::npos, separator.size());
    return {
        pos == std::string::npos ? std::string{} : string.substr(0, pos),
        pos == std::string::npos ? std::string{} : string.substr(pos, separator.size()),
        pos == std::string::npos ? string.substr(0) : string.substr(pos + separator.size())
    };
}